

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O0

BufferHandle * __thiscall
duckdb::TupleDataAllocator::PinHeapBlock
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkPart *part)

{
  bool bVar1;
  pointer ppVar2;
  BufferHandle *this_00;
  long in_RDX;
  long in_RSI;
  uint32_t *in_RDI;
  pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_duckdb::BufferHandle>_*,_std::vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>_>,_bool>
  pVar3;
  value_type *heap_block;
  iterator it;
  uint32_t *heap_block_index;
  buffer_handle_map_t *in_stack_ffffffffffffff48;
  vector<duckdb::TupleDataBlock,_false> *in_stack_ffffffffffffff50;
  uint32_t *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  BufferHandle *in_stack_ffffffffffffff70;
  buffer_handle_map_t *in_stack_ffffffffffffff80;
  undefined1 local_60 [24];
  pair<unsigned_int,_duckdb::BufferHandle> *local_48;
  undefined1 local_40;
  reference local_38;
  pair<unsigned_int,_duckdb::BufferHandle> *local_30;
  __normal_iterator<std::pair<unsigned_int,_duckdb::BufferHandle>_*,_std::vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>_>
  local_28;
  long local_20;
  long local_10;
  
  local_20 = in_RDX + 8;
  local_10 = in_RSI;
  local_28._M_current =
       (pair<unsigned_int,_duckdb::BufferHandle> *)
       buffer_handle_map_t::find
                 ((buffer_handle_map_t *)
                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                  in_stack_ffffffffffffff60);
  local_30 = (pair<unsigned_int,_duckdb::BufferHandle> *)
             buffer_handle_map_t::end(in_stack_ffffffffffffff48);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<unsigned_int,_duckdb::BufferHandle>_*,_std::vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>_>
                      *)in_stack_ffffffffffffff50,
                     (__normal_iterator<std::pair<unsigned_int,_duckdb::BufferHandle>_*,_std::vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>_>
                      *)in_stack_ffffffffffffff48);
  if (bVar1) {
    local_38 = vector<duckdb::TupleDataBlock,_false>::operator[]
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    this_00 = (BufferHandle *)(local_10 + 0x18);
    (**(code **)(**(long **)in_RDI + 0x38))(local_60,*(long **)in_RDI,local_38);
    pVar3 = buffer_handle_map_t::emplace(in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70)
    ;
    local_48 = (pair<unsigned_int,_duckdb::BufferHandle> *)pVar3.first._M_current;
    local_40 = pVar3.second;
    local_28._M_current = local_48;
    BufferHandle::~BufferHandle(this_00);
  }
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<unsigned_int,_duckdb::BufferHandle>_*,_std::vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>_>
           ::operator->(&local_28);
  return &ppVar2->second;
}

Assistant:

BufferHandle &TupleDataAllocator::PinHeapBlock(TupleDataPinState &pin_state, const TupleDataChunkPart &part) {
	const auto &heap_block_index = part.heap_block_index;
	auto it = pin_state.heap_handles.find(heap_block_index);
	if (it == pin_state.heap_handles.end()) {
		D_ASSERT(heap_block_index < heap_blocks.size());
		auto &heap_block = heap_blocks[heap_block_index];
		D_ASSERT(heap_block.handle);
		D_ASSERT(part.heap_block_offset < heap_block.size);
		D_ASSERT(part.heap_block_offset + part.total_heap_size <= heap_block.size);
		it = pin_state.heap_handles.emplace(heap_block_index, buffer_manager.Pin(heap_block.handle)).first;
	}
	return it->second;
}